

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O1

void xe::writeTestLog(BatchResult *result,ostream *stream)

{
  int *piVar1;
  char cVar2;
  TestStatusCode code;
  pointer pcVar3;
  long *plVar4;
  int iVar5;
  ostream *poVar6;
  pointer pSVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  ConstTestCaseResultPtr caseData;
  long *local_50;
  long *local_48;
  long local_40 [2];
  
  if ((result->m_sessionInfo).releaseName._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo releaseName ",0x19);
    pcVar3 = (result->m_sessionInfo).releaseName._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,
               pcVar3 + (result->m_sessionInfo).releaseName._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).releaseId._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo releaseId ",0x17);
    pcVar3 = (result->m_sessionInfo).releaseId._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,
               pcVar3 + (result->m_sessionInfo).releaseId._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).targetName._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo targetName ",0x18);
    pcVar3 = (result->m_sessionInfo).targetName._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,
               pcVar3 + (result->m_sessionInfo).targetName._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).candyTargetName._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo candyTargetName ",0x1d);
    pcVar3 = (result->m_sessionInfo).candyTargetName._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,
               pcVar3 + (result->m_sessionInfo).candyTargetName._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).configName._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo configName ",0x18);
    pcVar3 = (result->m_sessionInfo).configName._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,
               pcVar3 + (result->m_sessionInfo).configName._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).resultName._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo resultName ",0x18);
    pcVar3 = (result->m_sessionInfo).resultName._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,
               pcVar3 + (result->m_sessionInfo).resultName._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).timestamp._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo timestamp ",0x17);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(result->m_sessionInfo).timestamp._M_dataplus._M_p,
                        (result->m_sessionInfo).timestamp._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"#beginSession\n",0xe);
  pSVar7 = (result->m_testCaseResults).
           super__Vector_base<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(result->m_testCaseResults).
                              super__Vector_base<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7) >> 4)) {
    lVar13 = 8;
    lVar12 = 0;
    do {
      plVar4 = *(long **)((long)pSVar7 + lVar13 + -8);
      local_48 = *(long **)((long)&pSVar7->m_ptr + lVar13);
      if (local_48 != (long *)0x0) {
        LOCK();
        *(int *)(local_48 + 1) = (int)local_48[1] + 1;
        UNLOCK();
        LOCK();
        *(int *)((long)local_48 + 0xc) = *(int *)((long)local_48 + 0xc) + 1;
        UNLOCK();
      }
      local_50 = plVar4;
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n#beginTestCaseResult ",0x16);
      pcVar11 = (char *)*plVar4;
      if (pcVar11 == (char *)0x0) {
        std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
      }
      else {
        sVar8 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar11,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
      lVar10 = plVar4[9];
      iVar5 = (int)plVar4[10];
      if (iVar5 != (int)lVar10 && -1 < iVar5 - (int)lVar10) {
        lVar9 = 0;
        if (lVar10 != plVar4[10]) {
          lVar9 = lVar10;
        }
        std::ostream::write((char *)stream,lVar9);
        lVar10 = plVar4[9];
        lVar9 = 0;
        if (lVar10 != plVar4[10]) {
          lVar9 = lVar10;
        }
        cVar2 = *(char *)(lVar9 + (int)((int)plVar4[10] + ~(uint)lVar10));
        if ((cVar2 != '\n') && (cVar2 != '\r')) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
        }
      }
      code = *(TestStatusCode *)(plVar4 + 4);
      lVar10 = 0x13;
      if (code < TESTSTATUSCODE_LAST) {
        pcVar11 = "#endTestCaseResult\n";
        if ((0x2c00U >> (code & 0x1f) & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (stream,"#terminateTestCaseResult ",0x19);
          pcVar11 = getTestStatusCodeName(code);
          if (pcVar11 == (char *)0x0) {
            lVar10 = 1;
            std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
            pcVar11 = "\n";
          }
          else {
            sVar8 = strlen(pcVar11);
            lVar10 = 1;
            std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar11,sVar8);
            pcVar11 = "\n";
          }
        }
      }
      else {
        pcVar11 = "#endTestCaseResult\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar11,lVar10);
      if (local_48 != (long *)0x0) {
        LOCK();
        plVar4 = local_48 + 1;
        *(int *)plVar4 = (int)*plVar4 + -1;
        UNLOCK();
        if ((int)*plVar4 == 0) {
          local_50 = (long *)0x0;
          (**(code **)(*local_48 + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)local_48 + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_48 != (long *)0x0) {
            (**(code **)(*local_48 + 8))();
          }
          local_48 = (long *)0x0;
        }
      }
      lVar12 = lVar12 + 1;
      pSVar7 = (result->m_testCaseResults).
               super__Vector_base<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x10;
    } while (lVar12 < (int)((ulong)((long)(result->m_testCaseResults).
                                          super__Vector_base<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7)
                           >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n#endSession\n",0xd);
  return;
}

Assistant:

void writeTestLog (const BatchResult& result, std::ostream& stream)
{
	writeSessionInfo(result.getSessionInfo(), stream);

	stream << "#beginSession\n";

	for (int ndx = 0; ndx < result.getNumTestCaseResults(); ndx++)
	{
		ConstTestCaseResultPtr caseData = result.getTestCaseResult(ndx);
		writeTestCase(*caseData, stream);
	}

	stream << "\n#endSession\n";
}